

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  uchar *puVar1;
  char *pcVar2;
  ulong uVar3;
  char *__src;
  void *pvVar4;
  size_t __n;
  ulong uVar5;
  size_t __n_00;
  uchar *__src_00;
  secp256k1_scalar s;
  secp256k1_scalar r;
  char local_88 [8];
  uint64_t auStack_80 [3];
  char local_68 [16];
  uchar r_1 [33];
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x199,"test condition failed: ctx != NULL");
    abort();
  }
  if (output == (uchar *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar2 = "output != NULL";
  }
  else if (outputlen == (size_t *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar2 = "outputlen != NULL";
  }
  else {
    if (sig != (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_signature_load((secp256k1_context *)&r,&s,(secp256k1_scalar *)sig,sig);
      r_1[0x20] = '\0';
      r_1[0x10] = '\0';
      r_1[0x11] = '\0';
      r_1[0x12] = '\0';
      r_1[0x13] = '\0';
      r_1[0x14] = '\0';
      r_1[0x15] = '\0';
      r_1[0x16] = '\0';
      r_1[0x17] = '\0';
      r_1[0x18] = '\0';
      r_1[0x19] = '\0';
      r_1[0x1a] = '\0';
      r_1[0x1b] = '\0';
      r_1[0x1c] = '\0';
      r_1[0x1d] = '\0';
      r_1[0x1e] = '\0';
      r_1[0x1f] = '\0';
      r_1[0] = '\0';
      r_1[1] = '\0';
      r_1[2] = '\0';
      r_1[3] = '\0';
      r_1[4] = '\0';
      r_1[5] = '\0';
      r_1[6] = '\0';
      r_1[7] = '\0';
      r_1[8] = '\0';
      r_1[9] = '\0';
      r_1[10] = '\0';
      r_1[0xb] = '\0';
      r_1[0xc] = '\0';
      r_1[0xd] = '\0';
      r_1[0xe] = '\0';
      r_1[0xf] = '\0';
      local_68[0] = '\0';
      auStack_80[1] = 0;
      auStack_80[2] = 0;
      local_88 = (char  [8])0x0;
      auStack_80[0] = 0;
      secp256k1_scalar_get_b32(r_1 + 1,&r);
      secp256k1_scalar_get_b32((uchar *)(local_88 + 1),&s);
      uVar5 = 0x21;
      for (puVar1 = r_1;
          ((__n_00 = 1, __src_00 = r_1 + 0x20, 1 < uVar5 &&
           (__n_00 = uVar5, __src_00 = puVar1, *puVar1 == '\0')) && (-1 < (char)puVar1[1]));
          puVar1 = puVar1 + 1) {
        uVar5 = uVar5 - 1;
      }
      uVar5 = 0x21;
      for (pcVar2 = local_88;
          ((__src = local_68, __n = 1, 1 < uVar5 && (__src = pcVar2, __n = uVar5, *pcVar2 == '\0'))
          && (-1 < pcVar2[1])); pcVar2 = pcVar2 + 1) {
        uVar5 = uVar5 - 1;
      }
      uVar3 = __n + __n_00 + 6;
      uVar5 = *outputlen;
      *outputlen = uVar3;
      if (uVar5 < uVar3) {
        return 0;
      }
      *output = '0';
      output[1] = (uchar)__n + (uchar)__n_00 + '\x04';
      output[2] = '\x02';
      output[3] = (uchar)__n_00;
      memcpy(output + 4,__src_00,__n_00);
      output[__n_00 + 4] = '\x02';
      output[__n_00 + 5] = (uchar)__n;
      memcpy(output + __n_00 + 6,__src,__n);
      return 1;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar2 = "sig != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar4);
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}